

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall ThreadContext::LeaveScriptEnd<true>(ThreadContext *this,void *frameAddress)

{
  ScriptEntryExitRecord *pSVar1;
  code *pcVar2;
  bool bVar3;
  DWORD DVar4;
  undefined4 *puVar5;
  
  if (this->isScriptActive == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x732,"(!this->IsScriptActive())","!this->IsScriptActive()");
    if (!bVar3) goto LAB_007c6633;
    *puVar5 = 0;
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,RunPhase);
  if (bVar3) {
    DVar4 = GetCurrentThreadId();
    Output::Trace(RunPhase,L"%p> LeaveScriptEnd(%p): Level %d\n",(ulong)DVar4,this,
                  (ulong)this->callRootLevel);
    Output::Flush();
  }
  pSVar1 = this->entryExitRecord;
  if ((pSVar1 == (ScriptEntryExitRecord *)0x0) ||
     (pSVar1->frameIdOfScriptExitFunction == (void *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x73f,"(entryExitRecord && entryExitRecord->frameIdOfScriptExitFunction)",
                       "LeaveScriptEnd without LeaveScriptStart");
    if (!bVar3) goto LAB_007c6633;
    *puVar5 = 0;
  }
  if ((frameAddress != (void *)0x0) && (pSVar1->frameIdOfScriptExitFunction != frameAddress)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x741,
                       "(frameAddress == nullptr || frameAddress == entryExitRecord->frameIdOfScriptExitFunction)"
                       ,"Mismatched script exit frames");
    if (!bVar3) goto LAB_007c6633;
    *puVar5 = 0;
  }
  if ((undefined1  [56])((undefined1  [56])*pSVar1 & (undefined1  [56])0x8) == (undefined1  [56])0x0
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x742,"(!!entryExitRecord->leaveForHost == leaveForHost)",
                       "!!entryExitRecord->leaveForHost == leaveForHost");
    if (!bVar3) goto LAB_007c6633;
    *puVar5 = 0;
  }
  pSVar1->frameIdOfScriptExitFunction = (void *)0x0;
  if (this->isScriptActive == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x746,"(!this->IsScriptActive())",
                       "Missing LeaveScriptStart or LeaveScriptStart");
    if (!bVar3) {
LAB_007c6633:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this->isScriptActive = true;
  Memory::Recycler::SetIsScriptActive(this->recycler,true);
  this->implicitCallFlags = pSVar1->savedImplicitCallFlags | ImplicitCall_External;
  Js::ScriptContext::ProfileBegin(pSVar1->scriptContext,RunPhase);
  return;
}

Assistant:

void
ThreadContext::LeaveScriptEnd(void * frameAddress)
{
    Assert(!this->IsScriptActive());

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::RunPhase))
    {
        Output::Trace(Js::RunPhase, _u("%p> LeaveScriptEnd(%p): Level %d\n"), ::GetCurrentThreadId(), this, this->callRootLevel);
        Output::Flush();
    }
#endif

    Js::ScriptEntryExitRecord * entryExitRecord = this->GetScriptEntryExit();

    AssertMsg(entryExitRecord && entryExitRecord->frameIdOfScriptExitFunction,
              "LeaveScriptEnd without LeaveScriptStart");
    AssertMsg(frameAddress == nullptr || frameAddress == entryExitRecord->frameIdOfScriptExitFunction,
              "Mismatched script exit frames");
    Assert(!!entryExitRecord->leaveForHost == leaveForHost);

    entryExitRecord->frameIdOfScriptExitFunction = nullptr;

    AssertMsg(!this->IsScriptActive(), "Missing LeaveScriptStart or LeaveScriptStart");
    this->isScriptActive = true;
    this->GetRecycler()->SetIsScriptActive(true);

    Js::ImplicitCallFlags savedImplicitCallFlags = entryExitRecord->savedImplicitCallFlags;
    if (leaveForHost)
    {
        savedImplicitCallFlags = (Js::ImplicitCallFlags)(savedImplicitCallFlags | Js::ImplicitCall_External);
    }
    else if (entryExitRecord->hasReentered)
    {
        savedImplicitCallFlags = (Js::ImplicitCallFlags)(savedImplicitCallFlags | Js::ImplicitCall_AsyncHostOperation);
    }
    // Restore the implicit call flags
    this->SetImplicitCallFlags(savedImplicitCallFlags);

#ifdef PROFILE_EXEC
    if (leaveForHost)
    {
        entryExitRecord->scriptContext->ProfileBegin(Js::RunPhase);
    }
#endif
}